

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_buildDTable_internal
                 (FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  uint uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  int iVar6;
  size_t sVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  undefined2 uVar12;
  ulong uVar13;
  uint uVar14;
  short sVar15;
  size_t pos;
  long lVar16;
  U64 sv;
  long lVar17;
  U32 s_1;
  ulong uVar18;
  U32 s;
  ulong uVar19;
  ulong uVar20;
  undefined1 in_XMM0 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  bVar8 = (byte)tableLog;
  uVar14 = 1 << (bVar8 & 0x1f);
  sVar7 = 0xffffffffffffffd2;
  if (((maxSymbolValue < 0x100) &&
      (uVar13 = (ulong)(maxSymbolValue + 1), (1L << (bVar8 & 0x3f)) + uVar13 * 2 + 8 <= wkspSize))
     && (sVar7 = 0xffffffffffffffd4, tableLog < 0xd)) {
    uVar10 = (ulong)maxSymbolValue;
    lVar3 = uVar10 * 2 + 2;
    uVar1 = uVar14 - 1;
    uVar18 = (ulong)uVar1;
    uVar12 = 1;
    uVar19 = 0;
    do {
      sVar15 = normalizedCounter[uVar19];
      if (sVar15 == -1) {
        *(char *)((long)dt + uVar18 * 4 + 6) = (char)uVar19;
        sVar15 = 1;
        uVar18 = (ulong)((int)uVar18 - 1);
      }
      else if ((int)((uint)(0x8000 << (bVar8 & 0x1f)) >> 0x10) <= (int)sVar15) {
        uVar12 = 0;
      }
      *(short *)((long)workSpace + uVar19 * 2) = sVar15;
      uVar19 = uVar19 + 1;
    } while (uVar13 != uVar19);
    *(short *)dt = (short)tableLog;
    *(undefined2 *)((long)dt + 2) = uVar12;
    auVar5 = _DAT_00277800;
    if ((uint)uVar18 == uVar1) {
      iVar6 = (uVar14 >> 1) + (uVar14 >> 3) + 3;
      uVar18 = 0;
      auVar21 = pmovsxbq(in_XMM0,0x100);
      lVar16 = 0;
      lVar17 = 0;
      do {
        uVar2 = normalizedCounter[uVar18];
        *(long *)((long)workSpace + lVar16 + lVar3) = lVar17;
        if (8 < (long)(short)uVar2) {
          uVar11 = 0x10;
          if (0x10 < uVar2) {
            uVar11 = (int)(short)uVar2;
          }
          lVar4 = lVar16 + lVar3;
          uVar20 = (ulong)(uVar11 & 0xffff) - 9;
          auVar24._8_4_ = (int)uVar20;
          auVar24._0_8_ = uVar20;
          auVar24._12_4_ = (int)(uVar20 >> 0x20);
          auVar22._0_8_ = uVar20 >> 3;
          auVar22._8_8_ = auVar24._8_8_ >> 3;
          auVar22 = auVar22 ^ auVar5;
          uVar19 = 0;
          do {
            auVar23._8_4_ = (int)uVar19;
            auVar23._0_8_ = uVar19;
            auVar23._12_4_ = (int)(uVar19 >> 0x20);
            auVar24 = (auVar23 | auVar21) ^ auVar5;
            if ((bool)(~(auVar22._4_4_ < auVar24._4_4_ ||
                        auVar22._0_4_ < auVar24._0_4_ && auVar24._4_4_ == auVar22._4_4_) & 1)) {
              *(long *)((long)workSpace + uVar19 * 8 + lVar4 + 8) = lVar17;
            }
            if (auVar24._12_4_ <= auVar22._12_4_ &&
                (auVar24._8_4_ <= auVar22._8_4_ || auVar24._12_4_ != auVar22._12_4_)) {
              *(long *)((long)workSpace + uVar19 * 8 + lVar4 + 0x10) = lVar17;
            }
            uVar19 = uVar19 + 2;
          } while (((uVar20 >> 3) + 2 & 0xfffffffffffffffe) != uVar19);
        }
        lVar16 = lVar16 + (short)uVar2;
        uVar18 = uVar18 + 1;
        lVar17 = lVar17 + 0x101010101010101;
      } while (uVar18 != uVar13);
      uVar13 = 0;
      uVar11 = 0;
      do {
        *(undefined1 *)((long)dt + (ulong)(uVar11 & uVar1) * 4 + 6) =
             *(undefined1 *)((long)workSpace + uVar13 + uVar10 * 2 + 2);
        *(undefined1 *)((long)dt + (ulong)(uVar11 + iVar6 & uVar1) * 4 + 6) =
             *(undefined1 *)((long)workSpace + uVar13 + uVar10 * 2 + 3);
        uVar11 = uVar11 + iVar6 * 2 & uVar1;
        uVar13 = uVar13 + 2;
      } while (uVar13 < uVar14);
    }
    else {
      uVar10 = 0;
      uVar11 = 0;
      do {
        sVar15 = normalizedCounter[uVar10];
        if (0 < sVar15) {
          iVar6 = 0;
          do {
            *(char *)((long)dt + (ulong)uVar11 * 4 + 6) = (char)uVar10;
            do {
              uVar11 = uVar11 + (uVar14 >> 1) + (uVar14 >> 3) + 3 & uVar1;
            } while ((uint)uVar18 < uVar11);
            iVar6 = iVar6 + 1;
          } while (iVar6 != sVar15);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar13);
      if (uVar11 != 0) {
        return 0xffffffffffffffff;
      }
    }
    sVar7 = 0;
    uVar13 = 0;
    do {
      uVar18 = (ulong)*(byte *)((long)dt + uVar13 * 4 + 6);
      uVar2 = *(ushort *)((long)workSpace + uVar18 * 2);
      *(ushort *)((long)workSpace + uVar18 * 2) = uVar2 + 1;
      iVar6 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      bVar9 = bVar8 - (char)iVar6;
      *(byte *)((long)dt + uVar13 * 4 + 7) = bVar9;
      *(ushort *)(dt + uVar13 + 1) = (uVar2 << (bVar9 & 0x1f)) - (short)uVar14;
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  return sVar7;
}

Assistant:

static size_t FSE_buildDTable_internal(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16* symbolNext = (U16*)workSpace;
    BYTE* spread = (BYTE*)(symbolNext + maxSymbolValue + 1);

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (FSE_BUILD_DTABLE_WKSP_SIZE(tableLog, maxSymbolValue) > wkspSize) return ERROR(maxSymbolValue_tooLarge);
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        ZSTD_memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        size_t const tableMask = tableSize-1;
        size_t const step = FSE_TABLESTEP(tableSize);
        /* First lay down the symbols in order.
         * We use a uint64_t to lay down 8 bytes at a time. This reduces branch
         * misses since small blocks generally have small table logs, so nearly
         * all symbols have counts <= 8. We ensure we have 8 bytes at the end of
         * our buffer to handle the over-write.
         */
        {
            U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                pos += n;
            }
        }
        /* Now we spread those positions across the table.
         * The benefit of doing it in two stages is that we avoid the
         * variable size inner loop, which caused lots of branch misses.
         * Now we can run through all the positions without any branch misses.
         * We unroll the loop twice, since that is what empirically worked best.
         */
        {
            size_t position = 0;
            size_t s;
            size_t const unroll = 2;
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableDecode[uPosition].symbol = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);
        }
    } else {
        U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - ZSTD_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}